

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O2

void Interactive(HSQUIRRELVM v)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  void *__src;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  SQInteger done;
  undefined8 local_440;
  SQChar buffer [1024];
  
  done = 0;
  PrintVersionInfos();
  sq_pushroottable(v);
  sq_pushstring(v,"quit",0xffffffffffffffff);
  sq_pushuserpointer(v,&done);
  sq_newclosure(v,quit,1);
  sq_setparamscheck(v,1,0);
  sq_newslot(v,0xfffffffffffffffd,0);
  sq_pop(v,1);
  lVar6 = 0;
  bVar1 = false;
  lVar7 = 0;
LAB_001027c9:
  if (done != 0) {
    return;
  }
  printf("\nsq>");
  uVar8 = 0;
  do {
    if (done != 0) {
      return;
    }
    iVar2 = getchar();
    if (iVar2 == 0) {
LAB_00102803:
      if ((uVar8 == 0) || (buffer[uVar8 - 1] != '\\')) {
        iVar2 = 10;
        if (lVar7 == 0) break;
      }
      else {
        buffer[uVar8 - 1] = '\n';
        iVar2 = 10;
      }
    }
    else if (iVar2 == 0x7d) {
      lVar7 = lVar7 + -1;
      iVar2 = 0x7d;
    }
    else {
      if (iVar2 == 10) goto LAB_00102803;
      if ((iVar2 != 0x7b) || (bVar1)) {
        if ((iVar2 == 0x27) || (iVar2 == 0x22)) {
          bVar1 = !bVar1;
        }
        else if (0x3fe < uVar8) {
          fwrite("sq : input line too long\n",0x19,1,_stderr);
          goto LAB_00102872;
        }
      }
      else {
        lVar7 = lVar7 + 1;
        iVar2 = 0x7b;
        bVar1 = false;
      }
    }
    buffer[uVar8] = (SQChar)iVar2;
    uVar8 = uVar8 + 1;
  } while( true );
  lVar7 = 0;
LAB_00102872:
  buffer[uVar8] = '\0';
  if (buffer[0] == '=') {
    pcVar3 = (char *)sq_getscratchpad(v,0x400);
    snprintf(pcVar3,0x400,"return (%s)",buffer + 1);
    __src = (void *)sq_getscratchpad(v,0xffffffffffffffff);
    pcVar3 = (char *)sq_getscratchpad(v,0xffffffffffffffff);
    sVar4 = strlen(pcVar3);
    memcpy(buffer,__src,sVar4 + 1);
    lVar6 = 1;
  }
  sVar4 = strlen(buffer);
  if (0 < (long)sVar4) {
    local_440 = sq_gettop(v);
    lVar5 = sq_compilebuffer(v,buffer,sVar4,"interactive console",1);
    if (-1 < lVar5) {
      sq_pushroottable(v);
      lVar5 = sq_call(v,1,lVar6,1);
      if (lVar6 != 0 && -1 < lVar5) {
        putchar(10);
        sq_pushroottable(v);
        sq_pushstring(v,"print",0xffffffffffffffff);
        sq_get(v,0xfffffffffffffffe);
        sq_pushroottable(v);
        sq_push(v,0xfffffffffffffffc);
        sq_call(v,2,0,1);
        putchar(10);
        lVar6 = 0;
      }
    }
    sq_settop(v,local_440);
  }
  goto LAB_001027c9;
}

Assistant:

void Interactive(HSQUIRRELVM v)
{

#define MAXINPUT 1024
    SQChar buffer[MAXINPUT];
    SQInteger blocks =0;
    SQInteger string=0;
    SQInteger retval=0;
    SQInteger done=0;
    PrintVersionInfos();

    sq_pushroottable(v);
    sq_pushstring(v,_SC("quit"),-1);
    sq_pushuserpointer(v,&done);
    sq_newclosure(v,quit,1);
    sq_setparamscheck(v,1,NULL);
    sq_newslot(v,-3,SQFalse);
    sq_pop(v,1);

    while (!done)
    {
        SQInteger i = 0;
        scprintf(_SC("\nsq>"));
        for(;;) {
            int c;
            if(done)return;
#ifdef _TINSPIRE
            c = nio_getchar();
#else
            c = getchar();
#endif
            if (c == _SC('\n') || c == 0/*nspireio*/) {
                if (i>0 && buffer[i-1] == _SC('\\'))
                {
                    buffer[i-1] = _SC('\n');
                }
                else if(blocks==0)break;
                buffer[i++] = _SC('\n');
            }
            else if (c==_SC('}')) {blocks--; buffer[i++] = (SQChar)c;}
            else if(c==_SC('{') && !string){
                    blocks++;
                    buffer[i++] = (SQChar)c;
            }
            else if(c==_SC('"') || c==_SC('\'')){
                    string=!string;
                    buffer[i++] = (SQChar)c;
            }
            else if (i >= MAXINPUT-1) {
#ifdef _TINSPIRE
                scprintf(_SC("sq : input line too long\n"));
#else
                scfprintf(stderr, _SC("sq : input line too long\n"));
#endif
                break;
            }
            else{
                buffer[i++] = (SQChar)c;
            }
        }
        buffer[i] = _SC('\0');

        if(buffer[0]==_SC('=')){
            scsprintf(sq_getscratchpad(v,MAXINPUT),(size_t)MAXINPUT,_SC("return (%s)"),&buffer[1]);
            memcpy(buffer,sq_getscratchpad(v,-1),(scstrlen(sq_getscratchpad(v,-1))+1)*sizeof(SQChar));
            retval=1;
        }
        i=scstrlen(buffer);
        if(i>0){
            SQInteger oldtop=sq_gettop(v);
            if(SQ_SUCCEEDED(sq_compilebuffer(v,buffer,i,_SC("interactive console"),SQTrue))){
                sq_pushroottable(v);
                if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue)) &&  retval){
                    scprintf(_SC("\n"));
                    sq_pushroottable(v);
                    sq_pushstring(v,_SC("print"),-1);
                    sq_get(v,-2);
                    sq_pushroottable(v);
                    sq_push(v,-4);
                    sq_call(v,2,SQFalse,SQTrue);
                    retval=0;
                    scprintf(_SC("\n"));
                }
            }

            sq_settop(v,oldtop);
        }
    }
}